

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  Column_container *this_00;
  node_ptr plVar1;
  ulong uVar2;
  pointer p;
  mapped_type *pmVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  Index source;
  ulong uVar6;
  uint uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  Column_support *pCVar10;
  ID_index pivot;
  uint local_3c;
  Index local_38;
  Index local_34;
  
  local_38 = target;
  if ((this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_false,_true>_>_>_>
      .rowSwapped_ == true) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>
    ::_orderRows(&(this->reducedMatrixR_).
                  super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_false,_true>_>_>_>
                );
  }
  this_00 = &(this->reducedMatrixR_).matrix_;
  local_34 = target;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this_00,&local_34);
  plVar1 = (pmVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  pCVar10 = &pmVar3->column_;
  source = 0xffffffff;
  uVar7 = 0xffffffff;
  if (plVar1 != (node_ptr)pCVar10 && plVar1 != (node_ptr)0x0) {
    plVar1 = (pmVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
    if (plVar1 == (node_ptr)0x0) {
LAB_0011952a:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, false, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
    uVar7 = *(uint *)&plVar1[1].next_;
  }
  local_3c = uVar7;
  if (uVar7 == 0xffffffff) goto LAB_001193fc;
  uVar2 = (this->pivotToColumnIndex_)._M_h._M_bucket_count;
  uVar6 = (ulong)uVar7 % uVar2;
  p_Var8 = (this->pivotToColumnIndex_)._M_h._M_buckets[uVar6];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var8->_M_nxt, p_Var5 = p_Var8, *(uint *)&p_Var8->_M_nxt[1]._M_nxt != uVar7)) {
    while (p_Var8 = p_Var4, p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar2 != uVar6) ||
         (p_Var5 = p_Var8, *(uint *)&p_Var4[1]._M_nxt == uVar7)) goto LAB_001193e8;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_001193e8:
  if (p_Var5 == (__node_base_ptr)0x0) goto LAB_001193f2;
  p_Var4 = p_Var5->_M_nxt;
  do {
    source = 0xffffffff;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      source = *(Index *)((long)&p_Var4[1]._M_nxt + 4);
    }
LAB_001193fc:
    do {
      if ((local_3c == 0xffffffff) || (source == 0xffffffff)) {
        if (local_3c == 0xffffffff) {
          local_34 = local_38;
          pmVar3 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_34);
          RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
          ::_add_bar((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
                      *)this,(pmVar3->super_Column_dimension_option).dim_,eventIndex);
        }
        else {
          std::__detail::
          _Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::try_emplace<unsigned_int_const&,unsigned_int&>
                    ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->pivotToColumnIndex_,(const_iterator)0x0,&local_3c,&local_38);
          RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
          ::_update_barcode((RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
                             *)this,local_3c,eventIndex);
        }
        return;
      }
      _reduce_column_by(this,local_38,source);
      plVar1 = (pCVar10->super_type).data_.root_plus_size_.m_header.super_node.next_;
      source = 0xffffffff;
      uVar7 = 0xffffffff;
      if (plVar1 != (node_ptr)pCVar10 && plVar1 != (node_ptr)0x0) {
        plVar1 = (pmVar3->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
        if (plVar1 == (node_ptr)0x0) goto LAB_0011952a;
        uVar7 = *(uint *)&plVar1[1].next_;
      }
      local_3c = uVar7;
    } while (uVar7 == 0xffffffff);
    uVar2 = (this->pivotToColumnIndex_)._M_h._M_bucket_count;
    uVar6 = (ulong)uVar7 % uVar2;
    p_Var8 = (this->pivotToColumnIndex_)._M_h._M_buckets[uVar6];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var8, p_Var9 = p_Var8->_M_nxt, *(uint *)&p_Var8->_M_nxt[1]._M_nxt != uVar7)) {
      while (p_Var4 = p_Var9->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar2 != uVar6) ||
           (p_Var5 = p_Var9, p_Var9 = p_Var4, *(uint *)&p_Var4[1]._M_nxt == uVar7))
        goto LAB_001194bd;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_001194bd:
    if (p_Var5 == (__node_base_ptr)0x0) {
LAB_001193f2:
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var5->_M_nxt;
    }
  } while( true );
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}